

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

char * Strings::ulltoa(uint64 value,char *result,int base)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  uint64 tmp_value;
  char *pcStack_38;
  char tmp_char;
  char *ptr1;
  char *ptr;
  int base_local;
  char *result_local;
  uint64 value_local;
  
  if ((base < 2) || (pcVar2 = result, result_local = (char *)value, 0x24 < base)) {
    *result = '\0';
  }
  else {
    do {
      ptr1 = pcVar2;
      pcVar3 = (char *)((ulong)result_local / (ulong)(long)base);
      *ptr1 = result_local
              [(long)("zyxwvutsrqponmlkjihgfedcba9876543210123456789abcdefghijklmnopqrstuvwxyz" +
                     (0x23 - (long)pcVar3 * (long)base))];
      pcVar2 = ptr1 + 1;
      result_local = pcVar3;
    } while (pcVar3 != (char *)0x0);
    ptr1[1] = '\0';
    pcStack_38 = result;
    while (pcStack_38 < ptr1) {
      cVar1 = *ptr1;
      *ptr1 = *pcStack_38;
      *pcStack_38 = cVar1;
      pcStack_38 = pcStack_38 + 1;
      ptr1 = ptr1 + -1;
    }
  }
  return result;
}

Assistant:

char* ulltoa(uint64 value, char* result, int base)
    {
        if (base < 2 || base > 36) { *result = '\0'; return result; }
        char* ptr = result, *ptr1 = result, tmp_char;
        uint64 tmp_value;
        do {
            tmp_value = value;
            value /= base;
            *ptr++ = "zyxwvutsrqponmlkjihgfedcba9876543210123456789abcdefghijklmnopqrstuvwxyz" [35 + (tmp_value - value * base)];
        } while ( value );
        *ptr-- = '\0';
        // Then swap and reorder first to last
        while(ptr1 < ptr) {
            tmp_char = *ptr;
            *ptr--= *ptr1;
            *ptr1++ = tmp_char;
        }
        return result;
    }